

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEncName(xmlParserCtxtPtr ctxt)

{
  byte *pbVar1;
  byte *pbVar2;
  xmlParserInputPtr pxVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  
  bVar6 = *ctxt->input->cur;
  if ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) {
    pbVar1 = (byte *)(*xmlMallocAtomic)(10);
    if (pbVar1 != (byte *)0x0) {
      *pbVar1 = bVar6;
      xmlNextChar(ctxt);
      bVar6 = *ctxt->input->cur;
      iVar4 = 10;
      uVar5 = 1;
      do {
        if (((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) &&
           ((0x32 < bVar6 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar6 - 0x2d) & 0x3f) & 1) == 0))
           )) {
          pbVar1[uVar5 & 0xffffffff] = 0;
          return pbVar1;
        }
        pbVar2 = pbVar1;
        if (iVar4 <= (int)uVar5 + 1) {
          iVar4 = iVar4 * 2;
          pbVar2 = (byte *)(*xmlRealloc)(pbVar1,(long)iVar4);
          if (pbVar2 == (byte *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pbVar1);
            return (xmlChar *)0x0;
          }
        }
        pbVar1 = pbVar2;
        pbVar1[uVar5] = bVar6;
        xmlNextChar(ctxt);
        pxVar3 = ctxt->input;
        pbVar2 = pxVar3->cur;
        bVar6 = *pbVar2;
        if (bVar6 == 0) {
          if (ctxt->progressive == 0) {
            if ((500 < (long)pbVar2 - (long)pxVar3->base) &&
               ((long)pxVar3->end - (long)pbVar2 < 500)) {
              xmlSHRINK(ctxt);
              pxVar3 = ctxt->input;
              if (ctxt->progressive != 0) goto LAB_00166b82;
            }
            if ((long)pxVar3->end - (long)pxVar3->cur < 0xfa) {
              xmlGROW(ctxt);
              pxVar3 = ctxt->input;
            }
          }
LAB_00166b82:
          bVar6 = *pxVar3->cur;
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ENCODING_NAME,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseEncName(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    cur = CUR;
    if (((cur >= 'a') && (cur <= 'z')) ||
        ((cur >= 'A') && (cur <= 'Z'))) {
	buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}

	buf[len++] = cur;
	NEXT;
	cur = CUR;
	while (((cur >= 'a') && (cur <= 'z')) ||
	       ((cur >= 'A') && (cur <= 'Z')) ||
	       ((cur >= '0') && (cur <= '9')) ||
	       (cur == '.') || (cur == '_') ||
	       (cur == '-')) {
	    if (len + 1 >= size) {
	        xmlChar *tmp;

		size *= 2;
		tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
		if (tmp == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    xmlFree(buf);
		    return(NULL);
		}
		buf = tmp;
	    }
	    buf[len++] = cur;
	    NEXT;
	    cur = CUR;
	    if (cur == 0) {
	        SHRINK;
		GROW;
		cur = CUR;
	    }
        }
	buf[len] = 0;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ENCODING_NAME, NULL);
    }
    return(buf);
}